

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall psy::C::Lexer::Lexer(Lexer *this,SyntaxTree *tree)

{
  pointer pcVar1;
  long *plVar2;
  
  this->tree_ = tree;
  SyntaxTree::text(tree);
  plVar2 = (long *)psy::SourceText::rawText_abi_cxx11_();
  (this->text_)._M_dataplus._M_p = (pointer)&(this->text_).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this->text_,*plVar2,plVar2[1] + *plVar2);
  pcVar1 = (this->text_)._M_dataplus._M_p;
  this->c_strBeg_ = pcVar1;
  this->c_strEnd_ = pcVar1 + (this->text_)._M_string_length;
  this->yytext_ = pcVar1 + -1;
  this->yy_ = pcVar1 + -1;
  this->yychar_ = '\n';
  this->yylineno_ = 1;
  this->yycolumn_ = 0;
  this->offset_ = 0xffffffff;
  this->withinLogicalLine_ = false;
  this->syntaxK_splitTk = EndOfFile;
  (this->diagReporter_).lexer_ = this;
  return;
}

Assistant:

Lexer::Lexer(SyntaxTree* tree)
    : tree_(tree)
    , text_(tree->text().rawText())
    , c_strBeg_(text_.c_str())
    , c_strEnd_(text_.c_str() + text_.size())
    , yytext_(c_strBeg_ - 1)
    , yy_(yytext_)
    , yychar_('\n')
    , yylineno_(1)
    , yycolumn_(0)
    , offset_(~0)  // Start immediately "before" 0.
    , withinLogicalLine_(false)
    , syntaxK_splitTk(SyntaxKind::EndOfFile)
    , diagReporter_(this)
{}